

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_semaphore.c
# Opt level: O0

int csp_bin_sem_wait(csp_bin_sem_t *sem,uint timeout)

{
  int iVar1;
  uint uVar2;
  uint in_ESI;
  sem_t *in_RDI;
  uint32_t nsec;
  uint32_t sec;
  timespec ts;
  int ret;
  timespec local_28;
  int local_18;
  uint local_14;
  sem_t *local_10;
  int local_4;
  
  if (in_ESI == 0xffffffff) {
    local_18 = sem_wait(in_RDI);
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    iVar1 = clock_gettime(0,&local_28);
    if (iVar1 != 0) {
      return -1;
    }
    uVar2 = (local_14 % 1000) * 1000000;
    local_28.tv_sec = (ulong)(local_14 / 1000) + local_28.tv_sec;
    if (999999999 < (long)(local_28.tv_nsec + (ulong)uVar2)) {
      local_28.tv_sec = local_28.tv_sec + 1;
    }
    local_28.tv_nsec = (long)(local_28.tv_nsec + (ulong)uVar2) % 1000000000;
    local_18 = sem_timedwait(local_10,&local_28);
  }
  if (local_18 == 0) {
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int csp_bin_sem_wait(csp_bin_sem_t * sem, unsigned int timeout) {

	int ret;

	if (timeout == CSP_MAX_TIMEOUT) {
		ret = sem_wait((sem_t *) sem);
	} else {
		struct timespec ts;
		if (clock_gettime(CLOCK_REALTIME, &ts)) {
			return CSP_SEMAPHORE_ERROR;
		}

		uint32_t sec = timeout / 1000;
		uint32_t nsec = (timeout - 1000 * sec) * 1000000;

		ts.tv_sec += sec;

		if (ts.tv_nsec + nsec >= 1000000000) {
			ts.tv_sec++;
		}

		ts.tv_nsec = (ts.tv_nsec + nsec) % 1000000000;

		ret = sem_timedwait((sem_t *) sem, &ts);
	}

	if (ret != 0)
		return CSP_SEMAPHORE_ERROR;

	return CSP_SEMAPHORE_OK;
}